

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O1

TPZFMatrix<Fad<long_double>_> * __thiscall
TPZFMatrix<Fad<long_double>_>::NewMatrix(TPZFMatrix<Fad<long_double>_> *this)

{
  TPZFMatrix<Fad<long_double>_> *pTVar1;
  
  pTVar1 = (TPZFMatrix<Fad<long_double>_> *)operator_new(0x90);
  (pTVar1->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow = 0;
  (pTVar1->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol = 0;
  (pTVar1->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (pTVar1->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (pTVar1->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
       = (_func_int **)&PTR__TPZFMatrix_01846990;
  pTVar1->fElem = (Fad<long_double> *)0x0;
  pTVar1->fGiven = (Fad<long_double> *)0x0;
  pTVar1->fSize = 0;
  TPZVec<int>::TPZVec(&(pTVar1->fPivot).super_TPZVec<int>,0);
  (pTVar1->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  (pTVar1->fPivot).super_TPZVec<int>.fStore = (pTVar1->fPivot).fExtAlloc;
  (pTVar1->fPivot).super_TPZVec<int>.fNElements = 0;
  (pTVar1->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (pTVar1->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01846c80;
  (pTVar1->fWork).fStore = (Fad<long_double> *)0x0;
  (pTVar1->fWork).fNElements = 0;
  (pTVar1->fWork).fNAlloc = 0;
  return pTVar1;
}

Assistant:

inline TPZFMatrix<TVar>*NewMatrix() const override {return new TPZFMatrix<TVar>{};}